

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithBufferSubDataCase::init
          (ModifyAfterWithBufferSubDataCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  int iVar2;
  char *pcVar3;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_190 [384];
  
  if (this->m_repeatedUpload == true) {
    local_190._0_8_ =
         ((this->
          super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          ).
          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Testing performance of BufferSubData() command after \"specify buffer contents - draw buffer\" command pair is repeated "
                   );
    std::ostream::operator<<(poVar1,2);
    std::operator<<((ostream *)poVar1," times.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_190._0_8_ =
         ((this->
          super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          ).
          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
    std::operator<<((ostream *)(local_190 + 8),
                    "Testing performance of BufferSubData() command after a draw command that sources data from the target buffer."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_190 + 8));
  local_190._0_8_ =
       ((this->
        super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
        ).
        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
        .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  pcVar3 = "Buffer contents are fully respecified.\n";
  if (this->m_partialUpload != false) {
    pcVar3 = "Half of the buffer contents are modified.\n";
  }
  std::operator<<((ostream *)poVar1,pcVar3);
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  iVar2 = ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          ::init(&this->
                  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ,ctx_00);
  return iVar2;
}

Assistant:

void ModifyAfterWithBufferSubDataCase::init (void)
{
	// Log the purpose of the test

	if (m_repeatedUpload)
		m_testCtx.getLog() << tcu::TestLog::Message << "Testing performance of BufferSubData() command after \"specify buffer contents - draw buffer\" command pair is repeated " << (int)NUM_REPEATS << " times." << tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Testing performance of BufferSubData() command after a draw command that sources data from the target buffer." << tcu::TestLog::EndMessage;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< ((m_partialUpload) ?
			("Half of the buffer contents are modified.\n") :
			("Buffer contents are fully respecified.\n"))
		<< tcu::TestLog::EndMessage;

	ModifyAfterBasicCase<SingleOperationDuration>::init();
}